

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_mul_shift_var
               (secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b,uint shift)

{
  sbyte sVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_a8;
  ulong local_a0;
  ulong local_90;
  ulong local_88;
  uint shifthigh;
  uint shiftlow;
  uint shiftlimbs;
  uint64_t l [8];
  uint shift_local;
  secp256k1_scalar *b_local;
  secp256k1_scalar *a_local;
  secp256k1_scalar *r_local;
  
  l[7]._4_4_ = shift;
  secp256k1_scalar_mul_512((uint64_t *)&shiftlow,a,b);
  uVar2 = l[7]._4_4_ >> 6;
  uVar3 = l[7]._4_4_ & 0x3f;
  sVar1 = (sbyte)uVar3;
  bVar4 = 0x40 - sVar1;
  if (l[7]._4_4_ < 0x200) {
    if ((l[7]._4_4_ < 0x1c0) && (uVar3 != 0)) {
      local_88 = *(long *)(&shiftlow + (ulong)(uVar2 + 1) * 2) << (bVar4 & 0x3f);
    }
    else {
      local_88 = 0;
    }
    local_90 = *(ulong *)(&shiftlow + (ulong)uVar2 * 2) >> sVar1 | local_88;
  }
  else {
    local_90 = 0;
  }
  r->d[0] = local_90;
  if (l[7]._4_4_ < 0x1c0) {
    if ((l[7]._4_4_ < 0x180) && (uVar3 != 0)) {
      local_a0 = *(long *)(&shiftlow + (ulong)(uVar2 + 2) * 2) << (bVar4 & 0x3f);
    }
    else {
      local_a0 = 0;
    }
    local_a8 = *(ulong *)(&shiftlow + (ulong)(uVar2 + 1) * 2) >> sVar1 | local_a0;
  }
  else {
    local_a8 = 0;
  }
  r->d[1] = local_a8;
  if (l[7]._4_4_ < 0x180) {
    if ((l[7]._4_4_ < 0x140) && (uVar3 != 0)) {
      local_b8 = *(long *)(&shiftlow + (ulong)(uVar2 + 3) * 2) << (bVar4 & 0x3f);
    }
    else {
      local_b8 = 0;
    }
    local_c0 = *(ulong *)(&shiftlow + (ulong)(uVar2 + 2) * 2) >> sVar1 | local_b8;
  }
  else {
    local_c0 = 0;
  }
  r->d[2] = local_c0;
  if (l[7]._4_4_ < 0x140) {
    local_c8 = *(ulong *)(&shiftlow + (ulong)(uVar2 + 3) * 2) >> sVar1;
  }
  else {
    local_c8 = 0;
  }
  r->d[3] = local_c8;
  secp256k1_scalar_cadd_bit
            (r,0,(uint)(*(ulong *)(&shiftlow + (ulong)(l[7]._4_4_ - 1 >> 6) * 2) >>
                       ((char)l[7]._4_4_ - 1U & 0x3f)) & 1);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_scalar_mul_shift_var(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b, unsigned int shift) {
    uint64_t l[8];
    unsigned int shiftlimbs;
    unsigned int shiftlow;
    unsigned int shifthigh;
    VERIFY_CHECK(shift >= 256);
    secp256k1_scalar_mul_512(l, a, b);
    shiftlimbs = shift >> 6;
    shiftlow = shift & 0x3F;
    shifthigh = 64 - shiftlow;
    r->d[0] = shift < 512 ? (l[0 + shiftlimbs] >> shiftlow | (shift < 448 && shiftlow ? (l[1 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[1] = shift < 448 ? (l[1 + shiftlimbs] >> shiftlow | (shift < 384 && shiftlow ? (l[2 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[2] = shift < 384 ? (l[2 + shiftlimbs] >> shiftlow | (shift < 320 && shiftlow ? (l[3 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[3] = shift < 320 ? (l[3 + shiftlimbs] >> shiftlow) : 0;
    secp256k1_scalar_cadd_bit(r, 0, (l[(shift - 1) >> 6] >> ((shift - 1) & 0x3f)) & 1);
}